

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

int gdImageColorClosestHWB(gdImagePtr im,int r,int g,int b)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  RGBType RGB;
  RGBType RGB_00;
  HWBType HWB2;
  HWBType HWB1;
  HWBType local_60;
  HWBType local_54;
  float local_48;
  float fStack_44;
  undefined4 uStack_3c;
  
  if (im->trueColor == 0) {
    iVar1 = im->colorsTotal;
    if ((long)iVar1 < 1) {
      iVar3 = -1;
    }
    else {
      local_48 = (float)r / 255.0;
      uStack_3c = (undefined4)((ulong)((double)g / 255.0) >> 0x20);
      fStack_44 = (float)((double)g / 255.0);
      iVar4 = -1;
      iVar3 = -1;
      bVar2 = 1;
      fVar6 = 0.0;
      lVar5 = 0;
      do {
        if (im->open[lVar5] == 0) {
          RGB.G = (float)im->green[lVar5] / 255.0;
          RGB.R = (float)im->red[lVar5] / 255.0;
          RGB.B = (float)im->blue[lVar5] / 255.0;
          RGB_to_HWB(RGB,&local_54);
          RGB_00.G = fStack_44;
          RGB_00.R = local_48;
          RGB_00.B = (float)b / 255.0;
          RGB_to_HWB(RGB_00,&local_60);
          if ((((local_54.H != -1.0) || (fVar7 = 0.0, NAN(local_54.H))) &&
              ((local_60.H != -1.0 || (fVar7 = 0.0, NAN(local_60.H))))) &&
             (fVar7 = ABS(local_54.H - local_60.H), 3.0 < fVar7)) {
            fVar7 = 6.0 - fVar7;
          }
          fVar7 = (local_54.B - local_60.B) * (local_54.B - local_60.B) +
                  fVar7 * fVar7 + (local_54.W - local_60.W) * (local_54.W - local_60.W);
          iVar3 = (int)lVar5;
          if (!(bool)(fVar7 < fVar6 | bVar2)) {
            fVar7 = fVar6;
            iVar3 = iVar4;
          }
          fVar6 = fVar7;
          bVar2 = 0;
          iVar4 = iVar3;
        }
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
    }
  }
  else {
    iVar3 = g * 0x100 + r * 0x10000 + b;
  }
  return iVar3;
}

Assistant:

BGD_DECLARE(int) gdImageColorClosestHWB (gdImagePtr im, int r, int g, int b)
{
	int i;
	/* long rd, gd, bd; */
	int ct = (-1);
	int first = 1;
	float mindist = 0;
	if (im->trueColor) {
		return gdTrueColor (r, g, b);
	}
	for (i = 0; (i < (im->colorsTotal)); i++) {
		float dist;
		if (im->open[i]) {
			continue;
		}
		dist = HWB_Diff (im->red[i], im->green[i], im->blue[i], r, g, b);
		if (first || (dist < mindist)) {
			mindist = dist;
			ct = i;
			first = 0;
		}
	}
	return ct;
}